

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b1filter.cc
# Opt level: O1

void ProcessFile(ostream *OutFile,istream *InFile,char *name)

{
  byte bVar1;
  char *__s;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  pointer pbVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  ostream *poVar9;
  pointer pbVar10;
  pointer pbVar11;
  ulong uVar12;
  char cVar13;
  char cVar14;
  pointer pbVar15;
  long lVar16;
  bool bVar17;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  pointer local_70;
  value_type local_68;
  size_t local_48;
  ulong local_40;
  ostream *local_38;
  
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_38 = OutFile;
LAB_001026d9:
  std::__cxx11::string::_M_replace((ulong)&local_68,0,(char *)local_68._M_string_length,0x103057);
  bVar17 = false;
  bVar6 = false;
LAB_001026f1:
  while( true ) {
    bVar3 = bVar6;
    bVar2 = bVar17;
    iVar7 = std::istream::get();
    cVar13 = (char)&local_68;
    bVar17 = bVar2;
    bVar6 = bVar3;
    if (iVar7 < 0x26) break;
    if (iVar7 == 0x3a) {
      if (((bVar3) || (bVar2)) || (Extended != 0)) goto LAB_001027ec;
LAB_001027d9:
      std::__cxx11::string::append((char *)&local_68);
      bVar17 = false;
      bVar6 = false;
    }
    else if (iVar7 == 0x27) {
      std::__cxx11::string::push_back(cVar13);
      bVar6 = !bVar3 && !bVar2;
    }
    else {
      if (iVar7 != 0x26) goto LAB_0010279e;
      if ((!bVar3 && !bVar2) && Extended == 0) goto LAB_001027d9;
      bVar17 = false;
      bVar6 = false;
      if ((bVar3 || bVar2) || Extended == 0) goto LAB_001027ec;
    }
  }
  if (iVar7 < 0xd) {
    if (iVar7 == 0) goto LAB_001026f1;
    if (iVar7 == -1) {
      pbVar11 = local_88.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,
                        CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                 local_68.field_2._M_local_buf[0]) + 1);
        pbVar11 = local_88.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      goto LAB_00102855;
    }
    if (iVar7 == 10) goto LAB_0010281e;
  }
  else {
    if (iVar7 == 0xd) goto LAB_001026f1;
    if (iVar7 == 0x22) {
      std::__cxx11::string::push_back(cVar13);
      bVar17 = !bVar2 && !bVar3;
      goto LAB_001026f1;
    }
  }
LAB_0010279e:
  if (bVar3 || bVar2) {
LAB_001027ec:
    std::__cxx11::string::push_back(cVar13);
    bVar17 = bVar2;
    bVar6 = bVar3;
  }
  else {
    toupper(iVar7);
    std::__cxx11::string::push_back(cVar13);
    bVar17 = false;
    bVar6 = false;
  }
  goto LAB_001026f1;
LAB_00102855:
  poVar4 = local_38;
  if (pbVar11 ==
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar11 = local_88.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar17 = true;
      pbVar5 = local_88.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar15 = (pointer)0x0;
      do {
        pbVar10 = pbVar5;
        if ((!bVar17) && ((int)*(pbVar10->_M_dataplus)._M_p - 0x3aU < 0xfffffff6)) {
          std::__cxx11::string::append((char *)pbVar15);
        }
        bVar17 = false;
        pbVar11 = local_88.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar5 = pbVar10 + 1;
        pbVar15 = pbVar10;
      } while (pbVar10 + 1 !=
               local_88.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    for (; pbVar11 !=
           local_88.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish; pbVar11 = pbVar11 + 1) {
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(pbVar11->_M_dataplus)._M_p,pbVar11->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_88);
    return;
  }
  if (pbVar11->_M_string_length != 0) {
    lVar16 = 0;
    uVar12 = 0;
    local_70 = pbVar11;
LAB_00102875:
    do {
      __s = reserved[lVar16];
      local_48 = strlen(__s);
      iVar7 = (int)uVar12;
      local_40 = uVar12;
      if ((pbVar11->_M_dataplus)._M_p[iVar7] == *__s) {
        std::__cxx11::string::substr((ulong)&local_68,(ulong)pbVar11);
        iVar8 = std::__cxx11::string::compare((char *)&local_68);
        uVar12 = local_40;
        pbVar11 = local_70;
        bVar17 = iVar8 == 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,
                          CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                   local_68.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        bVar17 = false;
        pbVar11 = local_70;
      }
      iVar8 = 0;
      if (bVar17) {
        if (0 < (int)uVar12) {
          bVar1 = (pbVar11->_M_dataplus)._M_p[(uVar12 & 0xffffffff) - 1];
          iVar8 = isspace((int)(char)bVar1);
          if ((iVar8 == 0) &&
             ((0x3b < bVar1 || ((0x800ac8400000000U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0)))) {
            std::__cxx11::string::replace((ulong)pbVar11,(long)iVar7,(char *)0x0,0x103056);
            uVar12 = (ulong)((int)local_40 + 1);
            pbVar11 = local_70;
          }
        }
        iVar8 = (int)uVar12;
        uVar12 = (ulong)((int)local_48 + iVar8);
        bVar1 = (pbVar11->_M_dataplus)._M_p[uVar12];
        iVar7 = isspace((int)(char)bVar1);
        if ((iVar7 == 0) &&
           ((0x3b < bVar1 || ((0x800ac8400000000U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0)))) {
          std::__cxx11::string::replace((ulong)pbVar11,uVar12,(char *)0x0,0x103056);
          iVar8 = iVar8 + 1;
          pbVar11 = local_70;
        }
        uVar12 = (ulong)(uint)(iVar8 + (int)local_48);
        iVar8 = 7;
      }
      if (!bVar17) {
        lVar16 = lVar16 + 1;
        iVar8 = 4;
        if (lVar16 != 0x21) goto LAB_00102875;
      }
      if (iVar8 != 7) {
        if (iVar8 != 4) break;
        cVar13 = (pbVar11->_M_dataplus)._M_p[(int)uVar12];
        cVar14 = (char)pbVar11;
        if (cVar13 == '\"') {
          iVar7 = std::__cxx11::string::find(cVar14,0x22);
          if (iVar7 == -1) {
            std::__cxx11::string::push_back(cVar14);
          }
          else {
LAB_00102a2e:
            uVar12 = (ulong)(iVar7 + 1);
          }
        }
        else {
          if (cVar13 != '\'') {
            uVar12 = (ulong)((int)uVar12 + 1);
            goto LAB_00102a3f;
          }
          iVar7 = std::__cxx11::string::find(cVar14,0x27);
          if (iVar7 != -1) goto LAB_00102a2e;
          std::__cxx11::string::push_back(cVar14);
        }
        if (iVar7 == -1) break;
      }
LAB_00102a3f:
      lVar16 = 0;
    } while ((ulong)(long)(int)uVar12 < pbVar11->_M_string_length);
  }
  pbVar11 = pbVar11 + 1;
  goto LAB_00102855;
LAB_0010281e:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_88,&local_68);
  goto LAB_001026d9;
}

Assistant:

static void ProcessFile(
	std::ostream* OutFile,	//!< Output stream
	std::istream* InFile,	//!< Inout stream
	const char* name	//!< File name
)
{
//	std::cout << "Processing  " << name << std::endl;

	std::vector<std::string> source;

	LoadFile(InFile, source);
	MungFile(source);
	Writefile(OutFile, source);
}